

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O1

StatusCode __thiscall HttpConn::processRequest(HttpConn *this)

{
  size_type *psVar1;
  size_type *psVar2;
  string *psVar3;
  Method MVar4;
  size_t __n;
  int iVar5;
  StatusCode SVar6;
  __pid_t __pid;
  iterator iVar7;
  mapped_type *pmVar8;
  long lVar9;
  ssize_t sVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar11;
  char *pcVar12;
  bool bVar13;
  undefined1 local_10d0 [8];
  string name;
  char *local_128 [6];
  undefined1 local_f8 [8];
  char res [20];
  key_type local_d8;
  key_type local_b8;
  undefined1 local_98 [8];
  string sum;
  string path;
  string pwd;
  int pipefd [2];
  
  psVar2 = &name._M_string_length;
  local_10d0 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10d0,"Connection","");
  pmVar11 = &this->headers_;
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&pmVar11->_M_t,(key_type *)local_10d0);
  if (local_10d0 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_10d0);
  }
  if ((_Rb_tree_header *)iVar7._M_node != &(this->headers_)._M_t._M_impl.super__Rb_tree_header) {
    local_10d0 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_10d0,"Connection","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar11,(key_type *)local_10d0);
    iVar5 = std::__cxx11::string::compare((char *)pmVar8);
    if (iVar5 == 0) {
      bVar13 = true;
    }
    else {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Connection","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar11,&local_d8);
      iVar5 = std::__cxx11::string::compare((char *)pmVar8);
      bVar13 = iVar5 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
    }
    if (local_10d0 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_10d0);
    }
    if (bVar13) {
      this->linger_ = true;
    }
  }
  pcVar12 = "close";
  if (this->linger_ != false) {
    pcVar12 = "keep-alive";
  }
  local_10d0 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10d0,"Connection","");
  pmVar11 = &this->outputHeaders_;
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar11,(key_type *)local_10d0);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar12);
  if (local_10d0 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_10d0);
  }
  MVar4 = this->method_;
  if (MVar4 == Get) {
    psVar3 = &this->path_;
    iVar5 = std::__cxx11::string::compare((char *)psVar3);
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)psVar3);
      if (iVar5 == 0) {
        std::__cxx11::string::_M_replace
                  ((ulong)psVar3,0,(char *)(this->path_)._M_string_length,0x1212e3);
      }
      SVar6 = handleFile(this,psVar3);
      return SVar6;
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->body_,0,(char *)(this->body_)._M_string_length,0x121b57);
    local_10d0 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_10d0,"Content-Type","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar11,(key_type *)local_10d0);
    std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x1219c8);
LAB_00118ac2:
    if (local_10d0 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_10d0);
    }
    return OK;
  }
  if (MVar4 != Post) {
    if (MVar4 == Head) {
      Logger::Logger((Logger *)local_10d0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/HttpConn.cpp"
                     ,0x136);
      if (0x1d < (int)local_128 - (int)local_128[0]) {
        builtin_strncpy(local_128[0],"Processing HEAD request from ",0x1d);
        local_128[0] = local_128[0] + 0x1d;
      }
      __n = (this->from_)._M_string_length;
      if ((int)__n < (int)local_128 - (int)local_128[0]) {
        memcpy(local_128[0],(this->from_)._M_dataplus._M_p,__n);
        local_128[0] = local_128[0] + __n;
      }
      Logger::~Logger((Logger *)local_10d0);
      return OK;
    }
    return BadRequest;
  }
  psVar3 = &this->path_;
  iVar5 = std::__cxx11::string::compare((char *)psVar3);
  if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)psVar3), iVar5 == 0)) {
    local_10d0 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_10d0,"Content-Type","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar11,(key_type *)local_10d0);
    std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x1219c8);
    if (local_10d0 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_10d0);
    }
    psVar1 = &pwd._M_string_length;
    path.field_2._8_8_ = psVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&path.field_2 + 8),"username","");
    findInBody((string *)local_10d0,this,(string *)((long)&path.field_2 + 8));
    if ((size_type *)path.field_2._8_8_ != psVar1) {
      operator_delete((void *)path.field_2._8_8_);
    }
    sum.field_2._8_8_ = &path._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&sum.field_2 + 8),"password","");
    findInBody((string *)((long)&path.field_2 + 8),this,(string *)((long)&sum.field_2 + 8));
    if ((size_type *)sum.field_2._8_8_ != &path._M_string_length) {
      operator_delete((void *)sum.field_2._8_8_);
    }
    bVar13 = WebServer::existUser(this->server_,(string *)local_10d0);
    iVar5 = std::__cxx11::string::compare((char *)psVar3);
    if (iVar5 == 0) {
      if (bVar13) {
        pcVar12 = "Username Exists!";
      }
      else {
        WebServer::updateUser
                  (this->server_,(string *)local_10d0,(string *)((long)&path.field_2 + 8));
        pcVar12 = "Successful signup!";
      }
      std::__cxx11::string::_M_replace
                ((ulong)&this->body_,0,(char *)(this->body_)._M_string_length,(ulong)pcVar12);
    }
    iVar5 = std::__cxx11::string::compare((char *)psVar3);
    if (iVar5 == 0) {
      if (bVar13) {
        bVar13 = WebServer::verifyUser
                           (this->server_,(string *)local_10d0,(string *)((long)&path.field_2 + 8));
        pcVar12 = "Wrong username or wrong password";
        if (bVar13) {
          pcVar12 = "Successful login!";
        }
      }
      else {
        pcVar12 = "Wrong username or wrong password";
      }
      std::__cxx11::string::_M_replace
                ((ulong)&this->body_,0,(char *)(this->body_)._M_string_length,(ulong)pcVar12);
    }
    if ((size_type *)path.field_2._8_8_ != psVar1) {
      operator_delete((void *)path.field_2._8_8_);
    }
    goto LAB_00118ac2;
  }
  lVar9 = std::__cxx11::string::find((char *)psVar3,0x121be1,0);
  if ((lVar9 == -1) || (lVar9 = std::__cxx11::string::find((char *)psVar3,0x121be6,0), lVar9 == -1))
  goto LAB_00118d4f;
  iVar5 = pipe((int *)(pwd.field_2._M_local_buf + 8));
  if (iVar5 == 0) {
    path.field_2._8_8_ = &pwd._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&path.field_2 + 8),"x","");
    findInBody((string *)local_10d0,this,(string *)((long)&path.field_2 + 8));
    if ((size_type *)path.field_2._8_8_ != &pwd._M_string_length) {
      operator_delete((void *)path.field_2._8_8_);
    }
    sum.field_2._8_8_ = &path._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&sum.field_2 + 8),"y","");
    findInBody((string *)((long)&path.field_2 + 8),this,(string *)((long)&sum.field_2 + 8));
    if ((size_type *)sum.field_2._8_8_ != &path._M_string_length) {
      operator_delete((void *)sum.field_2._8_8_);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   &root_abi_cxx11_,"/..");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&sum.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   psVar3);
    if (local_98 != (undefined1  [8])&sum._M_string_length) {
      operator_delete((void *)local_98);
    }
    __pid = fork();
    if (__pid < 0) {
      pmVar11 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)0x1f4;
LAB_00118d12:
      bVar13 = false;
    }
    else {
      if (__pid != 0) {
        ::close(pwd.field_2._12_4_);
        sVar10 = ::read(pwd.field_2._8_4_,local_f8,1);
        if (sVar10 < 0) {
          pmVar11 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x1f4;
        }
        else {
          local_98 = (undefined1  [8])&sum._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,local_f8,local_f8 + -(sVar10 >> 0x3f));
          std::__cxx11::string::_M_assign((string *)&this->body_);
          printf("%d %d %d\n",(ulong)(uint)pwd.field_2._8_4_,(ulong)(uint)pwd.field_2._12_4_,
                 -(sVar10 >> 0x3f) & 0xffffffff);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Content-Type","");
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar11,&local_b8);
          std::__cxx11::string::operator=((string *)pmVar8,"text/plain");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          waitpid(__pid,(int *)0x0,0);
          ::close(pwd.field_2._8_4_);
          if (local_98 != (undefined1  [8])&sum._M_string_length) {
            operator_delete((void *)local_98);
          }
          pmVar11 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0xc8;
        }
        goto LAB_00118d12;
      }
      ::close(pwd.field_2._8_4_);
      dup2(pwd.field_2._12_4_,1);
      ::close(pwd.field_2._12_4_);
      execl((char *)sum.field_2._8_8_,(char *)local_10d0,path.field_2._8_8_,0);
      bVar13 = true;
    }
    SVar6 = (StatusCode)pmVar11;
    if ((size_type *)sum.field_2._8_8_ != &path._M_string_length) {
      operator_delete((void *)sum.field_2._8_8_);
    }
    if ((size_type *)path.field_2._8_8_ != &pwd._M_string_length) {
      operator_delete((void *)path.field_2._8_8_);
    }
    if (local_10d0 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_10d0);
    }
  }
  else {
    SVar6 = InternalError;
    bVar13 = false;
  }
  if (!bVar13) {
    return SVar6;
  }
LAB_00118d4f:
  local_10d0 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10d0,"./404.html","");
  handleFile(this,(string *)local_10d0);
  if (local_10d0 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_10d0);
  }
  return NotFound;
}

Assistant:

HttpConn::StatusCode HttpConn::processRequest() {
    if (headers_.find("Connection") != headers_.end()) {
        if (headers_["Connection"] == "keep-alive" || headers_["Connection"] == "Keep-Alive") {
            linger_ = true;
        } 
    }
    outputHeaders_["Connection"] = linger_ ? "keep-alive" : "close";
    if (method_ == Head) {
        LOG << "Processing HEAD request from " << from_;
        return OK;
    } else if (method_ == Get) {
        if (path_ == "/hello") {
            body_ = "Hello World";
            outputHeaders_["Content-Type"] = "text/plain";
            return OK;
        }
        if (path_ == "/")
            path_ = "/index.html";
        // LOG << "Processing GET request from " << from_ << ": get " << path_;
        return handleFile(path_);
    } else if (method_ == Post) {
        if (path_ == "/signup" || path_ == "/login") {
            
            outputHeaders_["Content-Type"] = "text/plain";
            std::string name = findInBody("username");
            std::string pwd = findInBody("password");
            bool exist = server_->existUser(name);
            if (path_ == "/signup") {
                if (exist) body_ = "Username Exists!";
                else {
                    server_->updateUser(name, pwd);
                    body_ = "Successful signup!";
                }
            }
            if (path_ == "/login") {
                if (!exist || !server_->verifyUser(name, pwd)) body_ = "Wrong username or wrong password";
                else body_ = "Successful login!";
            }

            return OK;
        }
        //issue: pipe does not work
        if (path_.find("/cgi") != path_.npos) {
            if (path_.find("/add") != path_.npos) {
                pid_t pid;
                int pipefd[2];
                if (pipe(pipefd) != 0) 
                    return InternalError;
                std::string x = findInBody("x");
                std::string y = findInBody("y");
                std::string path = root + "/.." + path_;
                if ((pid = fork()) < 0) {
                    return InternalError;
                } else if (pid == 0) {
                    ::close(pipefd[0]);
                    dup2(pipefd[1], STDOUT_FILENO);
                    ::close(pipefd[1]);
                    execl(path.c_str(), x.c_str(), y.c_str(), NULL);
                } else {
                    ::close(pipefd[1]);
                    char res[20];
                    int len;
                    if ((len = ::read(pipefd[0], res, 1) < 0)) {
                        return InternalError; 
                    }
                    std::string sum(res, res + len);
                    body_ = sum;
                    printf("%d %d %d\n",pipefd[0], pipefd[1], len);
                    outputHeaders_["Content-Type"] = "text/plain";
                    waitpid(pid, NULL, 0);
                    ::close(pipefd[0]);
                    return OK;
                }
            }
        }
        handleFile("./404.html");
        return NotFound;

    }
    return BadRequest;
}